

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void pybind11_init_impl(module *m)

{
  enum_<Neyn::Error> *peVar1;
  enum_<Neyn::Status> *peVar2;
  enum_<Neyn::Address> *this;
  class_<Filer_> *pcVar3;
  class_<Neyn::Request> *pcVar4;
  class_<Neyn::Response> *pcVar5;
  class_<Neyn::Config> *pcVar6;
  class_<Server_> *pcVar7;
  code *local_178;
  undefined8 local_170;
  constructor<> local_163 [2];
  constructor<> local_161;
  code *local_160;
  undefined8 local_158;
  constructor<> local_14b [2];
  constructor<> local_149;
  code *local_148;
  undefined8 local_140;
  constructor<> local_131;
  enum_<Neyn::Address> local_130;
  enum_<Neyn::Status> local_118;
  enum_<Neyn::Error> local_100;
  str_attr_accessor local_e8;
  int local_c4;
  str_attr_accessor local_c0;
  int local_9c;
  str_attr_accessor local_98;
  int local_74;
  PyObject *local_70;
  handle local_68;
  class_<Neyn::Response> response;
  class_<Neyn::Request> local_58;
  class_<Neyn::Request> request;
  handle local_48;
  class_<Server_> server;
  handle local_28;
  class_<Neyn::Config> config;
  class_<Filer_> local_18;
  class_<Filer_> filer;
  module *m_local;
  
  config.super_generic_type.super_object.super_handle.m_ptr =
       (generic_type)(m->super_object).super_handle.m_ptr;
  filer.super_generic_type.super_object.super_handle.m_ptr = (generic_type)(generic_type)m;
  pybind11::class_<Filer_>::class_<>
            (&local_18,(handle)config.super_generic_type.super_object.super_handle.m_ptr,"Filer");
  pybind11::class_<Neyn::Config>::class_<>
            ((class_<Neyn::Config> *)&local_28,
             *(PyObject **)filer.super_generic_type.super_object.super_handle.m_ptr,"Config");
  request.super_generic_type.super_object.super_handle.m_ptr =
       *(generic_type *)filer.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<Server_>::class_<>
            ((class_<Server_> *)&local_48,
             (handle)request.super_generic_type.super_object.super_handle.m_ptr,"Server");
  response.super_generic_type.super_object.super_handle.m_ptr =
       *(generic_type *)filer.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<Neyn::Request>::class_<>
            (&local_58,(handle)response.super_generic_type.super_object.super_handle.m_ptr,"Request"
            );
  local_70 = *(PyObject **)filer.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<Neyn::Response>::class_<>
            ((class_<Neyn::Response> *)&local_68,(handle)local_70,"Response");
  local_74 = 0;
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_98,
             (object_api<pybind11::handle> *)
             filer.super_generic_type.super_object.super_handle.m_ptr,"Major");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_98,&local_74);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_98);
  local_9c = 1;
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_c0,
             (object_api<pybind11::handle> *)
             filer.super_generic_type.super_object.super_handle.m_ptr,"Minor");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_c0,&local_9c);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_c0);
  local_c4 = 0;
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_e8,
             (object_api<pybind11::handle> *)
             filer.super_generic_type.super_object.super_handle.m_ptr,"Patch");
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_e8,&local_c4);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_e8);
  pybind11::enum_<Neyn::Error>::enum_<>(&local_100,&local_48,"Error");
  peVar1 = pybind11::enum_<Neyn::Error>::value(&local_100,"None",None,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"GeneralError",GeneralError,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"SocketError",SocketError,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"SocketCreate",SocketCreate,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"SocketListen",SocketListen,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"SocketAccept",SocketAccept,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"SetReuse",SetReuse,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"SetNonblock",SetNonblock,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"SetAddress",SetAddress,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"EpollCreate",EpollCreate,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"EpollAdd",EpollAdd,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"EpollWait",EpollWait,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"TimerCreate",TimerCreate,(char *)0x0);
  peVar1 = pybind11::enum_<Neyn::Error>::value(peVar1,"ThreadCreate",ThreadCreate,(char *)0x0);
  pybind11::enum_<Neyn::Error>::value(peVar1,"WrongParameter",WrongParameter,(char *)0x0);
  pybind11::enum_<Neyn::Error>::~enum_(&local_100);
  pybind11::enum_<Neyn::Status>::enum_<>(&local_118,&local_68,"Status");
  peVar2 = pybind11::enum_<Neyn::Status>::value(&local_118,"Continue",Continue,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"SwitchingProtocols",SwitchingProtocols,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Processing",Processing,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"OK",OK,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Created",Created,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Accepted",Accepted,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"NonAuthoritativeInformation",NonAuthoritativeInformation,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"NoContent",NoContent,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"ResetContent",ResetContent,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"PartialContent",PartialContent,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"MultiStatus",MultiStatus,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"AlreadyReported",AlreadyReported,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"IMUsed",IMUsed,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"MultipleChoices",MultipleChoices,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"MovedPermanently",MovedPermanently,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Found",Found,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"SeeOther",SeeOther,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"NotModified",NotModified,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"UseProxy",UseProxy,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"TemporaryRedirect",TemporaryRedirect,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"PermanentRedirect",PermanentRedirect,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"BadRequest",BadRequest,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Unauthorized",Unauthorized,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"PaymentRequired",PaymentRequired,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Forbidden",Forbidden,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"NotFound",NotFound,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"MethodNotAllowed",MethodNotAllowed,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"NotAcceptable",NotAcceptable,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"ProxyAuthenticationRequired",ProxyAuthenticationRequired,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"RequestTimeout",RequestTimeout,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Conflict",Conflict,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Gone",Gone,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"LengthRequired",LengthRequired,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"PreconditionFailed",PreconditionFailed,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"PayloadTooLarge",PayloadTooLarge,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"RequestURITooLong",RequestURITooLong,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"UnsupportedMediaType",UnsupportedMediaType,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"RequestedRangeNotSatisfiable",RequestedRangeNotSatisfiable,(char *)0x0
                     );
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"ExpectationFailed",ExpectationFailed,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"ImATeapot",ImATeapot,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"MisdirectedRequest",MisdirectedRequest,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"UnprocessableEntity",UnprocessableEntity,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"Locked",Locked,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"FailedDependency",FailedDependency,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"UpgradeRequired",UpgradeRequired,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"PreconditionRequired",PreconditionRequired,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"TooManyRequests",TooManyRequests,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"RequestHeaderFieldsTooLarge",RequestHeaderFieldsTooLarge,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"ConnectionClosedWithoutResponse",ConnectionClosedWithoutResponse,
                      (char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"UnavailableForLegalReasons",UnavailableForLegalReasons,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"ClientClosedRequest",ClientClosedRequest,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"InternalServerError",InternalServerError,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"NotImplemented",NotImplemented,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"BadGateway",BadGateway,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"ServiceUnavailable",ServiceUnavailable,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"GatewayTimeout",GatewayTimeout,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"HTTPVersionNotSupported",HTTPVersionNotSupported,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"VariantAlsoNegotiates",VariantAlsoNegotiates,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"InsufficientStorage",InsufficientStorage,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"LoopDetected",LoopDetected,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value(peVar2,"NotExtended",NotExtended,(char *)0x0);
  peVar2 = pybind11::enum_<Neyn::Status>::value
                     (peVar2,"NetworkAuthenticationRequired",NetworkAuthenticationRequired,
                      (char *)0x0);
  pybind11::enum_<Neyn::Status>::value
            (peVar2,"NetworkConnectTimeoutError",NetworkConnectTimeoutError,(char *)0x0);
  pybind11::enum_<Neyn::Status>::~enum_(&local_118);
  pybind11::enum_<Neyn::Address>::enum_<>(&local_130,&local_28,"Address");
  this = pybind11::enum_<Neyn::Address>::value(&local_130,"IPV4",IPV4,(char *)0x0);
  pybind11::enum_<Neyn::Address>::value(this,"IPV6",IPV6,(char *)0x0);
  pybind11::enum_<Neyn::Address>::~enum_(&local_130);
  pybind11::init<>();
  pcVar3 = pybind11::class_<Filer_>::def<>(&local_18,&local_131);
  pcVar3 = pybind11::class_<Filer_>::def_readwrite<Neyn::Filer,std::__cxx11::string>
                     (pcVar3,"root",0x20);
  pcVar3 = pybind11::class_<Filer_>::
           def_readwrite<Filer_,std::function<Neyn::Response(Neyn::Request_const&)>>
                     (pcVar3,"error",0x60);
  local_148 = Filer_::handle;
  local_140 = 0;
  pybind11::class_<Filer_>::def<Neyn::Response(Filer_::*)(Neyn::Request_const&)>
            (pcVar3,"handle",(offset_in_Filer__to_subr *)&local_148);
  pybind11::init<>();
  pcVar4 = pybind11::class_<Neyn::Request>::def<>(&local_58,&local_149);
  pcVar4 = pybind11::class_<Neyn::Request>::def_readwrite<Neyn::Request,std::__cxx11::string>
                     (pcVar4,"address",8);
  pcVar4 = pybind11::class_<Neyn::Request>::def_readwrite<Neyn::Request,unsigned_short>
                     (pcVar4,"port",0);
  pcVar4 = pybind11::class_<Neyn::Request>::def_readwrite<Neyn::Request,unsigned_short>
                     (pcVar4,"major",2);
  pcVar4 = pybind11::class_<Neyn::Request>::def_readwrite<Neyn::Request,unsigned_short>
                     (pcVar4,"minor",4);
  pcVar4 = pybind11::class_<Neyn::Request>::def_readwrite<Neyn::Request,std::__cxx11::string>
                     (pcVar4,"method",0x28);
  pcVar4 = pybind11::class_<Neyn::Request>::def_readwrite<Neyn::Request,std::__cxx11::string>
                     (pcVar4,"path",0x48);
  pcVar4 = pybind11::class_<Neyn::Request>::def_readwrite<Neyn::Request,std::__cxx11::string>
                     (pcVar4,"body",0x68);
  pybind11::class_<Neyn::Request>::
  def_readwrite<Neyn::Request,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (pcVar4,"header",0x88);
  pybind11::init<>();
  pcVar5 = pybind11::class_<Neyn::Response>::def<>((class_<Neyn::Response> *)&local_68,local_14b);
  pcVar5 = pybind11::class_<Neyn::Response>::def_readwrite<Neyn::Response,Neyn::Status>
                     (pcVar5,"status",0);
  pcVar5 = pybind11::class_<Neyn::Response>::def_readwrite<Neyn::Response,std::__cxx11::string>
                     (pcVar5,"body",8);
  pcVar5 = pybind11::class_<Neyn::Response>::
           def_readwrite<Neyn::Response,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                     (pcVar5,"header",0x28);
  local_160 = Neyn::Response::open;
  local_158 = 0;
  pybind11::class_<Neyn::Response>::def<bool(Neyn::Response::*)(std::__cxx11::string_const&)>
            (pcVar5,"open",(offset_in_Filer__to_subr *)&local_160);
  pybind11::init<>();
  pcVar6 = pybind11::class_<Neyn::Config>::def<>((class_<Neyn::Config> *)&local_28,&local_161);
  pcVar6 = pybind11::class_<Neyn::Config>::def_readwrite<Neyn::Config,unsigned_short>
                     (pcVar6,"port",0);
  pcVar6 = pybind11::class_<Neyn::Config>::def_readwrite<Neyn::Config,Neyn::Address>
                     (pcVar6,"ipvn",4);
  pcVar6 = pybind11::class_<Neyn::Config>::def_readwrite<Neyn::Config,std::__cxx11::string>
                     (pcVar6,"address",8);
  pcVar6 = pybind11::class_<Neyn::Config>::def_readwrite<Neyn::Config,unsigned_long>
                     (pcVar6,"timeout",0x28);
  pybind11::class_<Neyn::Config>::def_readwrite<Neyn::Config,unsigned_long>(pcVar6,"limit",0x30);
  pybind11::init<>();
  pcVar7 = pybind11::class_<Server_>::def<>((class_<Server_> *)&local_48,local_163);
  pcVar7 = pybind11::class_<Server_>::def_readwrite<Neyn::Server,Neyn::Config>(pcVar7,"config",0);
  pcVar7 = pybind11::class_<Server_>::
           def_readwrite<Server_,std::function<Neyn::Response(Neyn::Request_const&)>>
                     (pcVar7,"handler",0x68);
  local_178 = Neyn::Server::single;
  local_170 = 0;
  pybind11::class_<Server_>::def<Neyn::Error(Neyn::Server::*)()>
            (pcVar7,"run",(offset_in_Server_to_subr *)&local_178);
  pybind11::class_<Neyn::Response>::~class_((class_<Neyn::Response> *)&local_68);
  pybind11::class_<Neyn::Request>::~class_(&local_58);
  pybind11::class_<Server_>::~class_((class_<Server_> *)&local_48);
  pybind11::class_<Neyn::Config>::~class_((class_<Neyn::Config> *)&local_28);
  pybind11::class_<Filer_>::~class_(&local_18);
  return;
}

Assistant:

PYBIND11_MODULE(impl, m)
{
    // py::module m = _m.def_submodule("impl");
    py::class_<Filer_> filer(m, "Filer");
    py::class_<Config> config(m, "Config");
    py::class_<Server_> server(m, "Server");
    py::class_<Request> request(m, "Request");
    py::class_<Response> response(m, "Response");

    m.attr("Major") = NEYN_VERSION_MAJOR;
    m.attr("Minor") = NEYN_VERSION_MINOR;
    m.attr("Patch") = NEYN_VERSION_PATCH;

    py::enum_<Error>(server, "Error")
        .value("None", Error::None)
        .value("GeneralError", Error::GeneralError)
        .value("SocketError", Error::SocketError)
        .value("SocketCreate", Error::SocketCreate)
        .value("SocketListen", Error::SocketListen)
        .value("SocketAccept", Error::SocketAccept)
        .value("SetReuse", Error::SetReuse)
        .value("SetNonblock", Error::SetNonblock)
        .value("SetAddress", Error::SetAddress)
        .value("EpollCreate", Error::EpollCreate)
        .value("EpollAdd", Error::EpollAdd)
        .value("EpollWait", Error::EpollWait)
        .value("TimerCreate", Error::TimerCreate)
        .value("ThreadCreate", Error::ThreadCreate)
        .value("WrongParameter", Error::WrongParameter);

    py::enum_<Status>(response, "Status")
        .value("Continue", Status::Continue)
        .value("SwitchingProtocols", Status::SwitchingProtocols)
        .value("Processing", Status::Processing)
        .value("OK", Status::OK)
        .value("Created", Status::Created)
        .value("Accepted", Status::Accepted)
        .value("NonAuthoritativeInformation", Status::NonAuthoritativeInformation)
        .value("NoContent", Status::NoContent)
        .value("ResetContent", Status::ResetContent)
        .value("PartialContent", Status::PartialContent)
        .value("MultiStatus", Status::MultiStatus)
        .value("AlreadyReported", Status::AlreadyReported)
        .value("IMUsed", Status::IMUsed)
        .value("MultipleChoices", Status::MultipleChoices)
        .value("MovedPermanently", Status::MovedPermanently)
        .value("Found", Status::Found)
        .value("SeeOther", Status::SeeOther)
        .value("NotModified", Status::NotModified)
        .value("UseProxy", Status::UseProxy)
        .value("TemporaryRedirect", Status::TemporaryRedirect)
        .value("PermanentRedirect", Status::PermanentRedirect)
        .value("BadRequest", Status::BadRequest)
        .value("Unauthorized", Status::Unauthorized)
        .value("PaymentRequired", Status::PaymentRequired)
        .value("Forbidden", Status::Forbidden)
        .value("NotFound", Status::NotFound)
        .value("MethodNotAllowed", Status::MethodNotAllowed)
        .value("NotAcceptable", Status::NotAcceptable)
        .value("ProxyAuthenticationRequired", Status::ProxyAuthenticationRequired)
        .value("RequestTimeout", Status::RequestTimeout)
        .value("Conflict", Status::Conflict)
        .value("Gone", Status::Gone)
        .value("LengthRequired", Status::LengthRequired)
        .value("PreconditionFailed", Status::PreconditionFailed)
        .value("PayloadTooLarge", Status::PayloadTooLarge)
        .value("RequestURITooLong", Status::RequestURITooLong)
        .value("UnsupportedMediaType", Status::UnsupportedMediaType)
        .value("RequestedRangeNotSatisfiable", Status::RequestedRangeNotSatisfiable)
        .value("ExpectationFailed", Status::ExpectationFailed)
        .value("ImATeapot", Status::ImATeapot)
        .value("MisdirectedRequest", Status::MisdirectedRequest)
        .value("UnprocessableEntity", Status::UnprocessableEntity)
        .value("Locked", Status::Locked)
        .value("FailedDependency", Status::FailedDependency)
        .value("UpgradeRequired", Status::UpgradeRequired)
        .value("PreconditionRequired", Status::PreconditionRequired)
        .value("TooManyRequests", Status::TooManyRequests)
        .value("RequestHeaderFieldsTooLarge", Status::RequestHeaderFieldsTooLarge)
        .value("ConnectionClosedWithoutResponse", Status::ConnectionClosedWithoutResponse)
        .value("UnavailableForLegalReasons", Status::UnavailableForLegalReasons)
        .value("ClientClosedRequest", Status::ClientClosedRequest)
        .value("InternalServerError", Status::InternalServerError)
        .value("NotImplemented", Status::NotImplemented)
        .value("BadGateway", Status::BadGateway)
        .value("ServiceUnavailable", Status::ServiceUnavailable)
        .value("GatewayTimeout", Status::GatewayTimeout)
        .value("HTTPVersionNotSupported", Status::HTTPVersionNotSupported)
        .value("VariantAlsoNegotiates", Status::VariantAlsoNegotiates)
        .value("InsufficientStorage", Status::InsufficientStorage)
        .value("LoopDetected", Status::LoopDetected)
        .value("NotExtended", Status::NotExtended)
        .value("NetworkAuthenticationRequired", Status::NetworkAuthenticationRequired)
        .value("NetworkConnectTimeoutError", Status::NetworkConnectTimeoutError);

    py::enum_<Address>(config, "Address")  //
        .value("IPV4", Address::IPV4)
        .value("IPV6", Address::IPV6);

    filer.def(py::init<>())
        .def_readwrite("root", &Filer_::root)
        .def_readwrite("error", &Filer_::_error)
        .def("handle", &Filer_::handle);

    request.def(py::init<>())
        .def_readwrite("address", &Request::address)
        .def_readwrite("port", &Request::port)
        .def_readwrite("major", &Request::major)
        .def_readwrite("minor", &Request::minor)
        .def_readwrite("method", &Request::method)
        .def_readwrite("path", &Request::path)
        .def_readwrite("body", &Request::body)
        .def_readwrite("header", &Request::header);

    response.def(py::init<>())
        .def_readwrite("status", &Response::status)
        .def_readwrite("body", &Response::body)
        .def_readwrite("header", &Response::header)
        .def("open", &Response::open);

    config.def(py::init<>())
        .def_readwrite("port", &Config::port)
        .def_readwrite("ipvn", &Config::ipvn)
        .def_readwrite("address", &Config::address)
        .def_readwrite("timeout", &Config::timeout)
        .def_readwrite("limit", &Config::limit);
    // .def_readwrite("threads", &Config::threads);

    server.def(py::init<>())
        .def_readwrite("config", &Server_::config)
        .def_readwrite("handler", &Server_::_handler)
        .def("run", &Server_::single);
}